

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O2

double despot::POMCP::Simulate
                 (State *particle,RandomStreams *streams,VNode *vnode,DSPOMDP *model,
                 POMCPPrior *prior)

{
  DSPOMDP *model_00;
  bool bVar1;
  uint action;
  int iVar2;
  log_ostream *plVar3;
  ostream *poVar4;
  QNode *this;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *this_00;
  mapped_type *ppVVar5;
  VNode *pVVar6;
  double dVar7;
  double reward;
  OBS_TYPE obs;
  double local_58;
  key_type local_50;
  DSPOMDP *local_48;
  double local_40;
  QNode *local_38;
  
  local_48 = model;
  bVar1 = RandomStreams::Exhausted(streams);
  dVar7 = 0.0;
  if (!bVar1) {
    action = UpperBoundAction(vnode,prior->exploration_constant_);
    iVar2 = logging::level();
    if (0 < iVar2) {
      iVar2 = logging::level();
      if (3 < iVar2) {
        plVar3 = logging::stream(4);
        poVar4 = despot::operator<<(&plVar3->super_ostream,particle);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    iVar2 = logging::level();
    if (0 < iVar2) {
      iVar2 = logging::level();
      if (3 < iVar2) {
        plVar3 = logging::stream(4);
        poVar4 = std::operator<<(&plVar3->super_ostream,"depth = ");
        iVar2 = VNode::depth(vnode);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        poVar4 = std::operator<<(poVar4,"; action = ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,action);
        poVar4 = std::operator<<(poVar4,"; ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,particle->scenario_id);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    RandomStreams::Entry(streams,particle->scenario_id);
    iVar2 = (*local_48->_vptr_DSPOMDP[2])(local_48,particle,(ulong)action,&local_58,&local_50);
    this = VNode::Child(vnode,action);
    if ((char)iVar2 == '\0') {
      (*prior->_vptr_POMCPPrior[6])(prior,(ulong)action,local_50);
      RandomStreams::Advance(streams);
      local_38 = this;
      this_00 = QNode::children(this);
      ppVVar5 = std::
                map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                ::operator[](this_00,&local_50);
      local_40 = DAT_0019fdd8;
      if (*ppVVar5 == (mapped_type)0x0) {
        iVar2 = VNode::depth(vnode);
        model_00 = local_48;
        dVar7 = Rollout(particle,streams,iVar2 + 1,local_48,prior);
        local_58 = local_40 * dVar7 + local_58;
        iVar2 = VNode::depth(vnode);
        pVVar6 = CreateVNode(iVar2 + 1,particle,prior,model_00);
        ppVVar5 = std::
                  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                  ::operator[](this_00,&local_50);
        *ppVVar5 = pVVar6;
      }
      else {
        ppVVar5 = std::
                  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                  ::operator[](this_00,&local_50);
        dVar7 = Simulate(particle,streams,*ppVVar5,local_48,prior);
        local_58 = local_40 * dVar7 + local_58;
      }
      RandomStreams::Back(streams);
      (*prior->_vptr_POMCPPrior[7])(prior);
      this = local_38;
    }
    QNode::Add(this,local_58);
    VNode::Add(vnode,local_58);
    dVar7 = local_58;
  }
  return dVar7;
}

Assistant:

double POMCP::Simulate(State* particle, RandomStreams& streams, VNode* vnode,
	const DSPOMDP* model, POMCPPrior* prior) {
	if (streams.Exhausted())
		return 0;

	double explore_constant = prior->exploration_constant();

	ACT_TYPE action = POMCP::UpperBoundAction(vnode, explore_constant);
	logd << *particle << endl;
	logd << "depth = " << vnode->depth() << "; action = " << action << "; "
		<< particle->scenario_id << endl;

	double reward;
	OBS_TYPE obs;
	bool terminal = model->Step(*particle, streams.Entry(particle->scenario_id),
		action, reward, obs);

	QNode* qnode = vnode->Child(action);
	if (!terminal) {
		prior->Add(action, obs);
		streams.Advance();
		map<OBS_TYPE, VNode*>& vnodes = qnode->children();
		if (vnodes[obs] != NULL) {
			reward += Globals::Discount()
				* Simulate(particle, streams, vnodes[obs], model, prior);
		} else { // Rollout upon encountering a node not in curren tree, then add the node
			reward += Globals::Discount() 
        * Rollout(particle, streams, vnode->depth() + 1, model, prior);
			vnodes[obs] = CreateVNode(vnode->depth() + 1, particle, prior,
				model);
		}
		streams.Back();
		prior->PopLast();
	}

	qnode->Add(reward);
	vnode->Add(reward);

	return reward;
}